

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryBase.hpp
# Opt level: O1

void __thiscall
Diligent::EngineFactoryBase<Diligent::IEngineFactoryVk>::QueryInterface
          (EngineFactoryBase<Diligent::IEngineFactoryVk> *this,INTERFACE_ID *IID,
          IObject **ppInterface)

{
  bool bVar1;
  
  if (ppInterface == (IObject **)0x0) {
    return;
  }
  *ppInterface = (IObject *)0x0;
  bVar1 = INTERFACE_ID::operator==(IID,(INTERFACE_ID *)Diligent::IID_Unknown);
  if (((!bVar1) && (bVar1 = INTERFACE_ID::operator==(IID,&this->m_FactoryIID), !bVar1)) &&
     (bVar1 = INTERFACE_ID::operator==(IID,(INTERFACE_ID *)IID_EngineFactory), !bVar1)) {
    return;
  }
  *ppInterface = (IObject *)this;
  (*(this->super_IEngineFactoryVk).super_IEngineFactory.super_IObject._vptr_IObject[1])(this);
  return;
}

Assistant:

QueryInterface(const INTERFACE_ID& IID, IObject** ppInterface) override final
    {
        if (ppInterface == nullptr)
            return;

        *ppInterface = nullptr;
        if (IID == IID_Unknown || IID == m_FactoryIID || IID == IID_EngineFactory)
        {
            *ppInterface = this;
            (*ppInterface)->AddRef();
        }
    }